

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

ItemFlags __thiscall QTableModel::flags(QTableModel *this,QModelIndex *index)

{
  bool bVar1;
  QFlagsStorage<Qt::ItemFlag> QVar2;
  QTableWidgetItem *pQVar3;
  
  bVar1 = QModelIndex::isValid(index);
  if (bVar1) {
    pQVar3 = item(this,index);
    if (pQVar3 == (QTableWidgetItem *)0x0) {
      QVar2.i = 0x3f;
    }
    else {
      QVar2.i = (pQVar3->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.
                super_QFlagsStorage<Qt::ItemFlag>.i;
    }
  }
  else {
    QVar2.i = 8;
  }
  return (QFlagsStorageHelper<Qt::ItemFlag,_4>)(QFlagsStorageHelper<Qt::ItemFlag,_4>)QVar2.i;
}

Assistant:

Qt::ItemFlags QTableModel::flags(const QModelIndex &index) const
{
    if (!index.isValid())
        return Qt::ItemIsDropEnabled;
    if (QTableWidgetItem *itm = item(index))
        return itm->flags();
    return (Qt::ItemIsEditable
            |Qt::ItemIsSelectable
            |Qt::ItemIsUserCheckable
            |Qt::ItemIsEnabled
            |Qt::ItemIsDragEnabled
            |Qt::ItemIsDropEnabled);
}